

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O1

aiColor3D __thiscall
Assimp::FBX::FBXConverter::GetColorPropertyFromMaterial
          (FBXConverter *this,PropertyTable *props,string *baseName,bool *result)

{
  PropertyTable *props_00;
  bool in_R8B;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  aiColor3D aVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,*(long *)result,*(long *)(result + 8) + *(long *)result);
  std::__cxx11::string::append((char *)&local_50);
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_70,*(long *)result,*(long *)(result + 8) + *(long *)result);
  props_00 = (PropertyTable *)0x7b9afa;
  std::__cxx11::string::append((char *)local_70);
  aVar1 = GetColorPropertyFactored(this,props_00,baseName,&local_50,(bool *)local_70,in_R8B);
  aVar1.b = aVar1.b;
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
    aVar1.b = aVar1.b;
    aVar1.r = (ai_real)(int)extraout_XMM0_Qa;
    aVar1.g = (ai_real)(int)((ulong)extraout_XMM0_Qa >> 0x20);
  }
  aVar1.b = aVar1.b;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
    aVar1.b = aVar1.b;
    aVar1.r = (ai_real)(int)extraout_XMM0_Qa_00;
    aVar1.g = (ai_real)(int)((ulong)extraout_XMM0_Qa_00 >> 0x20);
  }
  return aVar1;
}

Assistant:

aiColor3D FBXConverter::GetColorPropertyFromMaterial(const PropertyTable& props, const std::string& baseName,
            bool& result)
        {
            return GetColorPropertyFactored(props, baseName + "Color", baseName + "Factor", result, true);
        }